

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bibOutline.cpp
# Opt level: O1

EntryData * getEntryData(EntryData *__return_storage_ptr__,TSNode entryNode,File *file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  TSNode self;
  TSNode node;
  TSNode node_00;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint32_t uVar6;
  char *pcVar7;
  uint32_t child_index;
  Range RVar8;
  TSNode child;
  _Alloc_hider local_70;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  TSTree *in_stack_ffffffffffffffb8;
  void *local_40;
  TSTree *pTStack_38;
  
  pcVar7 = ts_node_type(entryNode);
  iVar5 = strcmp(pcVar7,"entry");
  if (iVar5 != 0) {
    __assert_fail("strcmp(ts_node_type(entryNode), \"entry\") == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/src/handlers/outline/bibOutline.cpp"
                  ,0x12,"EntryData getEntryData(TSNode, File &)");
  }
  node.context[2] = (int)in_stack_ffffffffffffffa8;
  node.context[3] = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  node.context[0] = (int)in_stack_ffffffffffffffa0;
  node.context[1] = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  node.id = (void *)in_stack_ffffffffffffffb0;
  node.tree = in_stack_ffffffffffffffb8;
  RVar8 = nodeRange(node);
  EntryData::EntryData(__return_storage_ptr__,RVar8);
  uVar6 = ts_node_named_child_count(entryNode);
  if (uVar6 != 0) {
    bVar4 = false;
    child_index = 0;
    do {
      ts_node_named_child((TSNode *)&stack0xffffffffffffffb0,entryNode,child_index);
      self.context._8_8_ = in_stack_ffffffffffffffb8;
      self.context[0] = (uint32_t)in_stack_ffffffffffffffb0;
      self.context[1] = SUB84(in_stack_ffffffffffffffb0,4);
      self.id = local_40;
      self.tree = pTStack_38;
      pcVar7 = ts_node_type(self);
      iVar5 = strcmp(pcVar7,"name");
      if (iVar5 == 0) {
        File::utf8TextForNode_abi_cxx11_
                  ((string *)&local_70,file,(TSNode *)&stack0xffffffffffffffb0);
        std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,(string *)&local_70)
        ;
        if (local_70._M_p != &stack0xffffffffffffffa0) {
          operator_delete(local_70._M_p,in_stack_ffffffffffffffa0 + 1);
        }
        node_00.context[2] = (int)in_stack_ffffffffffffffa8;
        node_00.context[3] = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
        node_00.context[0] = (int)in_stack_ffffffffffffffa0;
        node_00.context[1] = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
        node_00.id = (void *)in_stack_ffffffffffffffb0;
        node_00.tree = in_stack_ffffffffffffffb8;
        RVar8 = nodeRange(node_00);
        __return_storage_ptr__->selectionRange = RVar8;
        iVar5 = std::__cxx11::string::compare((char *)&__return_storage_ptr__->name);
        bVar3 = true;
        if (iVar5 == 0) {
          __return_storage_ptr__->kind = File;
        }
      }
      else {
        iVar5 = strcmp(pcVar7,"key");
        bVar3 = true;
        if (iVar5 == 0) {
          File::utf8TextForNode_abi_cxx11_
                    ((string *)&local_70,file,(TSNode *)&stack0xffffffffffffffb0);
          std::__cxx11::string::operator=
                    ((string *)&__return_storage_ptr__->key,(string *)&local_70);
          if (local_70._M_p != &stack0xffffffffffffffa0) {
            operator_delete(local_70._M_p,in_stack_ffffffffffffffa0 + 1);
          }
          bVar4 = true;
          bVar3 = false;
        }
      }
      if (!bVar3) {
        if (bVar4) {
          return __return_storage_ptr__;
        }
        pcVar2 = (__return_storage_ptr__->key)._M_dataplus._M_p;
        paVar1 = &(__return_storage_ptr__->key).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != paVar1) {
          operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        }
        pcVar2 = (__return_storage_ptr__->name)._M_dataplus._M_p;
        paVar1 = &(__return_storage_ptr__->name).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 == paVar1) {
          return __return_storage_ptr__;
        }
        operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
        return __return_storage_ptr__;
      }
      child_index = child_index + 1;
    } while (uVar6 != child_index);
  }
  return __return_storage_ptr__;
}

Assistant:

EntryData getEntryData (TSNode entryNode, File &file) {
    assert(strcmp(ts_node_type(entryNode), "entry") == 0);

    EntryData data { nodeRange(entryNode) };

    auto numChildren = ts_node_named_child_count(entryNode);
    for (uint32_t i = 0; i < numChildren; i++) {
        TSNode child = ts_node_named_child(entryNode, i);
        const char *type = ts_node_type(child);
        if (strcmp(type, "name") == 0) {
            data.name = file.utf8TextForNode(child);
            data.selectionRange = nodeRange(child);
            setEntryKind(data);
        } else if (strcmp(type, "key") == 0) {
            data.key = file.utf8TextForNode(child);
            return data;
        }
    }

    return data;
}